

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

bool double_conversion::Advance<char*>(char **it,uc16 separator,int base,char **end)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  undefined2 in_register_00000032;
  bool bVar5;
  
  pcVar4 = *it;
  if (CONCAT22(in_register_00000032,separator) == 0) {
    *it = pcVar4 + 1;
    bVar5 = pcVar4 + 1 == *(char **)CONCAT44(in_register_00000014,base);
  }
  else {
    iVar3 = (int)*pcVar4;
    bVar5 = 0xfffffff5 < iVar3 - 0x3aU;
    pcVar1 = pcVar4 + 1;
    *it = pcVar1;
    pcVar2 = *(char **)CONCAT44(in_register_00000014,base);
    if ((!bVar5 || iVar3 >= 0x38) || pcVar1 == pcVar2) {
      return bVar5 && iVar3 < 0x38 || pcVar1 == pcVar2;
    }
    pcVar4 = pcVar4 + 2;
    if (pcVar4 == pcVar2) {
      return false;
    }
    if (((int)*pcVar1 == CONCAT22(in_register_00000032,separator)) &&
       ((int)*pcVar4 - 0x30U < 10 && *pcVar4 < 0x38)) {
      *it = pcVar4;
    }
    bVar5 = *it == *(char **)CONCAT44(in_register_00000014,base);
  }
  return bVar5;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}